

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_remove_node_hash(lyxp_set *set,lyd_node *node,lyxp_node_type type)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  lyxp_set_hash_node hnode;
  lyd_node *local_28;
  lyxp_node_type local_20 [2];
  
  if (set->ht != (ly_ht *)0x0) {
    local_28 = node;
    local_20[0] = type;
    uVar1 = lyht_hash_multi(0,(char *)&local_28,8);
    uVar1 = lyht_hash_multi(uVar1,(char *)local_20,4);
    uVar1 = lyht_hash_multi(uVar1,(char *)0x0,0);
    LVar2 = lyht_remove(set->ht,&local_28,uVar1);
    if (LVar2 != LY_SUCCESS) {
      __assert_fail("!r",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,800,
                    "void set_remove_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                   );
    }
    if (set->ht->used == 0) {
      lyht_free(set->ht,(_func_void_void_ptr *)0x0);
      set->ht = (ly_ht *)0x0;
    }
  }
  return;
}

Assistant:

static void
set_remove_node_hash(struct lyxp_set *set, struct lyd_node *node, enum lyxp_node_type type)
{
    LY_ERR r;
    struct lyxp_set_hash_node hnode;
    uint32_t hash;

    if (set->ht) {
        hnode.node = node;
        hnode.type = type;

        hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
        hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
        hash = lyht_hash_multi(hash, NULL, 0);

        r = lyht_remove(set->ht, &hnode, hash);
        assert(!r);
        (void)r;

        if (!set->ht->used) {
            lyht_free(set->ht, NULL);
            set->ht = NULL;
        }
    }
}